

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O0

void * tommy_hashtable_remove
                 (tommy_hashtable *hashtable,undefined1 *cmp,void *cmp_arg,tommy_hash_t hash)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  tommy_node *local_40;
  tommy_hashtable_node *node;
  tommy_count_t pos;
  tommy_hash_t hash_local;
  void *cmp_arg_local;
  undefined1 *cmp_local;
  tommy_hashtable *hashtable_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = hash & hashtable->bucket_mask;
  local_40 = hashtable->bucket[uVar2];
  do {
    if (local_40 == (tommy_node *)0x0) {
      hashtable_local = (tommy_hashtable *)0x0;
LAB_001182c7:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return hashtable_local;
      }
      __stack_chk_fail();
    }
    if (local_40->key == hash) {
      iVar3 = (*(code *)cmp)(cmp_arg,local_40->data);
      if (iVar3 == 0) {
        tommy_list_remove_existing(hashtable->bucket + uVar2,local_40);
        hashtable->count = hashtable->count - 1;
        hashtable_local = (tommy_hashtable *)local_40->data;
        goto LAB_001182c7;
      }
    }
    local_40 = local_40->next;
  } while( true );
}

Assistant:

void* tommy_hashtable_remove(tommy_hashtable* hashtable, tommy_search_func* cmp, const void* cmp_arg, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashtable->bucket_mask;
	tommy_hashtable_node* node = hashtable->bucket[pos];

	while (node) {
		/* we first check if the hash matches, as in the same bucket we may have multiples hash values */
		if (node->key == hash && cmp(cmp_arg, node->data) == 0) {
			tommy_list_remove_existing(&hashtable->bucket[pos], node);

			--hashtable->count;

			return node->data;
		}
		node = node->next;
	}

	return 0;
}